

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O0

QString * __thiscall
DumpWrapperToFileCommand::makeFileName
          (QString *__return_storage_ptr__,DumpWrapperToFileCommand *this,offset_t wrapperOffset)

{
  ostream *poVar1;
  char *ch;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream sstr;
  ostream local_198 [376];
  offset_t local_20;
  offset_t wrapperOffset_local;
  DumpWrapperToFileCommand *this_local;
  
  local_20 = wrapperOffset;
  wrapperOffset_local = (offset_t)this;
  this_local = (DumpWrapperToFileCommand *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"wrapper");
  if (local_20 != 0xffffffffffffffff) {
    poVar1 = std::operator<<(local_198,"_at_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(poVar1,local_20);
  }
  std::operator<<(local_198,".bin");
  std::__cxx11::stringstream::str();
  ch = (char *)std::__cxx11::string::c_str();
  QString::QString(__return_storage_ptr__,ch);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

QString makeFileName(const offset_t wrapperOffset) 
    {
        std::stringstream sstr;
        sstr << "wrapper";
        if (wrapperOffset != INVALID_ADDR) {
            sstr << "_at_" << std::hex << wrapperOffset;
        }
        sstr << ".bin";
        return QString(sstr.str().c_str());
    }